

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O0

bool __thiscall FIX::Session::nextQueued(Session *this,SEQNUM num,UtcTimeStamp *now)

{
  bool bVar1;
  FieldMap *this_00;
  StringField *lhs;
  unsigned_long value;
  MsgType *msgType;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  undefined1 local_180 [8];
  Message msg;
  UtcTimeStamp *now_local;
  SEQNUM num_local;
  Session *this_local;
  
  msg._336_8_ = now;
  Message::Message((Message *)local_180);
  bVar1 = SessionState::retrieve(&this->m_state,num,(Message *)local_180);
  if (!bVar1) {
    this_local._7_1_ = false;
    goto LAB_002a5d6b;
  }
  IntTConvertor<unsigned_long>::convert_abi_cxx11_
            ((string *)&msgType,(IntTConvertor<unsigned_long> *)num,value);
  std::operator+(&local_1b0,"Processing QUEUED message: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&msgType);
  SessionState::onEvent(&this->m_state,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&msgType);
  this_00 = &Message::getHeader((Message *)local_180)->super_FieldMap;
  lhs = &FieldMap::getField<FIX::MsgType>(this_00)->super_StringField;
  bVar1 = FIX::operator==(lhs,"A");
  if (bVar1) {
LAB_002a5cbf:
    SessionState::incrNextTargetMsgSeqNum(&this->m_state);
  }
  else {
    bVar1 = FIX::operator==(lhs,"2");
    if (bVar1) goto LAB_002a5cbf;
    next(this,(Message *)local_180,(UtcTimeStamp *)msg._336_8_,true);
  }
  this_local._7_1_ = true;
LAB_002a5d6b:
  Message::~Message((Message *)local_180);
  return this_local._7_1_;
}

Assistant:

bool Session::nextQueued(SEQNUM num, const UtcTimeStamp &now) {
  Message msg;

  if (m_state.retrieve(num, msg)) {
    m_state.onEvent("Processing QUEUED message: " + SEQNUM_CONVERTOR::convert(num));
    auto const &msgType = msg.getHeader().getField<MsgType>();
    if (msgType == MsgType_Logon || msgType == MsgType_ResendRequest) {
      m_state.incrNextTargetMsgSeqNum();
    } else {
      next(msg, now, true);
    }
    return true;
  }
  return false;
}